

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void indexedXp_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint8_t *puVar1;
  byte bVar2;
  long lVar3;
  cs_m680x_op *op;
  ushort uVar4;
  
  uVar4 = *address;
  *address = uVar4 + 1;
  lVar3 = (ulong)uVar4 - (ulong)info->offset;
  if ((uint)lVar3 < info->size) {
    uVar4 = (ushort)info->code[lVar3];
  }
  else {
    uVar4 = 0;
  }
  bVar2 = (info->m680x).op_count;
  (info->m680x).op_count = bVar2 + 1;
  op = (info->m680x).operands + bVar2;
  op->type = M680X_OP_INDEXED;
  set_operand_size(info,op,(uint8_t)address);
  *(undefined8 *)&(info->m680x).operands[bVar2].field_1 = 0xd;
  puVar1 = &(info->m680x).operands[bVar2].field_1.idx.flags;
  *puVar1 = *puVar1 | 4;
  *(ushort *)((long)&(info->m680x).operands[bVar2].field_1 + 8) = uVar4;
  *(undefined4 *)((long)&(info->m680x).operands[bVar2].field_1 + 10) = 0x1080000;
  return;
}

Assistant:

static void indexedXp_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint8_t offset = 0;

	read_byte(info, &offset, (*address)++);

	add_indexed_operand(info, M680X_REG_X, true, 1, M680X_OFFSET_BITS_8,
		(uint16_t)offset, false);
}